

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O3

void uECC_vli_modInv(uECC_word_t *result,uECC_word_t *input,uECC_word_t *mod,wordcount_t num_words)

{
  ulong uVar1;
  wordcount_t i;
  ulong uVar2;
  ulong *puVar3;
  long lVar4;
  ulong uVar5;
  ulong *puVar6;
  ulong uVar7;
  ulong uVar8;
  uECC_word_t *uv;
  ulong *puVar9;
  uECC_word_t u [4];
  uECC_word_t v [4];
  uECC_word_t b [4];
  uECC_word_t a [4];
  uECC_word_t local_c8 [4];
  uECC_word_t local_a8 [4];
  ulong local_88;
  uECC_word_t *local_80;
  ulong local_78 [4];
  ulong local_58 [5];
  
  if ('\0' < num_words) {
    uVar1 = (ulong)(byte)num_words;
    uVar5 = 0;
    uVar2 = 0;
    do {
      uVar2 = uVar2 | input[uVar5];
      uVar5 = uVar5 + 1;
    } while (uVar1 != uVar5);
    local_88 = (ulong)((uint)(byte)num_words * 8);
    if (uVar2 == 0) {
      memset(result,0,local_88);
      return;
    }
    local_80 = result;
    memcpy(local_58,input,local_88);
    memcpy(local_78,mod,local_88);
    memset(local_c8,0,local_88);
    local_c8[0] = 1;
    memset(local_a8,0,local_88);
    uVar2 = (ulong)((uint)(byte)num_words * 8);
    puVar6 = (ulong *)((long)local_78 + uVar2);
    puVar9 = (ulong *)((long)local_58 + uVar2);
    uVar2 = uVar1;
    while (uVar2 = uVar2 - 1, -1 < (char)uVar2) {
      uVar7 = (ulong)(((uint)uVar2 & 0x7f) << 3);
      uVar5 = *(ulong *)((long)local_58 + uVar7);
      uVar7 = *(ulong *)((long)local_78 + uVar7);
      if (uVar5 != uVar7) {
        if (((byte)local_58[0] & 1) == 0) {
          uVar2 = 0;
          puVar3 = puVar9;
          do {
            uVar5 = puVar3[-1];
            puVar3[-1] = uVar5 >> 1 | uVar2;
            puVar3 = puVar3 + -1;
            uVar2 = uVar5 << 0x3f;
          } while (local_58 < puVar3);
LAB_00109d55:
          uv = local_c8;
        }
        else {
          if (((byte)local_78[0] & 1) == 0) {
            uVar2 = 0;
            puVar3 = puVar6;
            do {
              uVar5 = puVar3[-1];
              puVar3[-1] = uVar5 >> 1 | uVar2;
              puVar3 = puVar3 + -1;
              uVar2 = uVar5 << 0x3f;
            } while (local_78 < puVar3);
          }
          else {
            uVar2 = 0;
            if (uVar7 < uVar5) {
              uVar5 = 0;
              do {
                uVar8 = local_78[uVar2] + uVar5;
                puVar3 = local_58 + uVar2;
                uVar7 = *puVar3;
                *puVar3 = *puVar3 - uVar8;
                if (uVar8 != 0) {
                  uVar5 = (ulong)(uVar7 < uVar8);
                }
                uVar2 = uVar2 + 1;
              } while (uVar1 != uVar2);
              uVar2 = 0;
              puVar3 = puVar9;
              do {
                uVar5 = puVar3[-1];
                puVar3[-1] = uVar5 >> 1 | uVar2;
                puVar3 = puVar3 + -1;
                uVar2 = uVar5 << 0x3f;
                lVar4 = uVar1 - 1;
              } while (local_58 < puVar3);
              do {
                if ((char)lVar4 < '\0') goto LAB_00109e43;
                uVar5 = (ulong)(((uint)lVar4 & 0x7f) << 3);
                uVar2 = *(ulong *)((long)local_c8 + uVar5);
                uVar5 = *(ulong *)((long)local_a8 + uVar5);
                if (uVar5 < uVar2) goto LAB_00109e43;
                lVar4 = lVar4 + -1;
              } while (uVar5 <= uVar2);
              uVar5 = 0;
              uVar2 = 0;
              do {
                uVar7 = local_c8[uVar5];
                uVar8 = uVar7 + uVar2 + mod[uVar5];
                if (uVar8 != uVar7) {
                  uVar2 = (ulong)(uVar8 < uVar7);
                }
                local_c8[uVar5] = uVar8;
                uVar5 = uVar5 + 1;
              } while (uVar1 != uVar5);
LAB_00109e43:
              uVar5 = 0;
              uVar2 = 0;
              do {
                uVar8 = local_a8[uVar5] + uVar2;
                puVar3 = local_c8 + uVar5;
                uVar7 = *puVar3;
                *puVar3 = *puVar3 - uVar8;
                if (uVar8 != 0) {
                  uVar2 = (ulong)(uVar7 < uVar8);
                }
                uVar5 = uVar5 + 1;
              } while (uVar1 != uVar5);
              goto LAB_00109d55;
            }
            uVar5 = 0;
            do {
              uVar8 = local_58[uVar2] + uVar5;
              puVar3 = local_78 + uVar2;
              uVar7 = *puVar3;
              *puVar3 = *puVar3 - uVar8;
              if (uVar8 != 0) {
                uVar5 = (ulong)(uVar7 < uVar8);
              }
              uVar2 = uVar2 + 1;
            } while (uVar1 != uVar2);
            uVar2 = 0;
            puVar3 = puVar6;
            do {
              uVar5 = puVar3[-1];
              puVar3[-1] = uVar5 >> 1 | uVar2;
              puVar3 = puVar3 + -1;
              uVar2 = uVar5 << 0x3f;
              lVar4 = uVar1 - 1;
            } while (local_78 < puVar3);
            do {
              if ((char)lVar4 < '\0') goto LAB_00109f12;
              uVar5 = (ulong)(((uint)lVar4 & 0x7f) << 3);
              uVar2 = *(ulong *)((long)local_a8 + uVar5);
              uVar5 = *(ulong *)((long)local_c8 + uVar5);
              if (uVar5 < uVar2) goto LAB_00109f12;
              lVar4 = lVar4 + -1;
            } while (uVar5 <= uVar2);
            uVar5 = 0;
            uVar2 = 0;
            do {
              uVar7 = local_a8[uVar5];
              uVar8 = uVar7 + uVar2 + mod[uVar5];
              if (uVar8 != uVar7) {
                uVar2 = (ulong)(uVar8 < uVar7);
              }
              local_a8[uVar5] = uVar8;
              uVar5 = uVar5 + 1;
            } while (uVar1 != uVar5);
LAB_00109f12:
            uVar5 = 0;
            uVar2 = 0;
            do {
              uVar8 = local_c8[uVar5] + uVar2;
              puVar3 = local_a8 + uVar5;
              uVar7 = *puVar3;
              *puVar3 = *puVar3 - uVar8;
              if (uVar8 != 0) {
                uVar2 = (ulong)(uVar7 < uVar8);
              }
              uVar5 = uVar5 + 1;
            } while (uVar1 != uVar5);
          }
          uv = local_a8;
        }
        vli_modInv_update(uv,mod,num_words);
        uVar2 = uVar1;
      }
    }
    memcpy(local_80,local_c8,local_88);
  }
  return;
}

Assistant:

uECC_VLI_API void uECC_vli_modInv(uECC_word_t *result,
                                  const uECC_word_t *input,
                                  const uECC_word_t *mod,
                                  wordcount_t num_words) {
    uECC_word_t a[uECC_MAX_WORDS], b[uECC_MAX_WORDS], u[uECC_MAX_WORDS], v[uECC_MAX_WORDS];
    cmpresult_t cmpResult;

    if (uECC_vli_isZero(input, num_words)) {
        uECC_vli_clear(result, num_words);
        return;
    }

    uECC_vli_set(a, input, num_words);
    uECC_vli_set(b, mod, num_words);
    uECC_vli_clear(u, num_words);
    u[0] = 1;
    uECC_vli_clear(v, num_words);
    while ((cmpResult = uECC_vli_cmp_unsafe(a, b, num_words)) != 0) {
        if (EVEN(a)) {
            uECC_vli_rshift1(a, num_words);
            vli_modInv_update(u, mod, num_words);
        } else if (EVEN(b)) {
            uECC_vli_rshift1(b, num_words);
            vli_modInv_update(v, mod, num_words);
        } else if (cmpResult > 0) {
            uECC_vli_sub(a, a, b, num_words);
            uECC_vli_rshift1(a, num_words);
            if (uECC_vli_cmp_unsafe(u, v, num_words) < 0) {
                uECC_vli_add(u, u, mod, num_words);
            }
            uECC_vli_sub(u, u, v, num_words);
            vli_modInv_update(u, mod, num_words);
        } else {
            uECC_vli_sub(b, b, a, num_words);
            uECC_vli_rshift1(b, num_words);
            if (uECC_vli_cmp_unsafe(v, u, num_words) < 0) {
                uECC_vli_add(v, v, mod, num_words);
            }
            uECC_vli_sub(v, v, u, num_words);
            vli_modInv_update(v, mod, num_words);
        }
    }
    uECC_vli_set(result, u, num_words);
}